

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O2

void __thiscall
pybind11::array::array<double>
          (array *this,ShapeContainer *shape,StridesContainer *strides,double *ptr,handle base)

{
  object local_70;
  _Vector_base<long,_std::allocator<long>_> local_68;
  _Vector_base<long,_std::allocator<long>_> local_48;
  
  detail::npy_format_descriptor<double,_void>::dtype();
  local_48._M_impl.super__Vector_impl_data._M_start =
       (shape->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_48._M_impl.super__Vector_impl_data._M_finish =
       (shape->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
       (shape->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (shape->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (shape->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (shape->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start =
       (strides->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_68._M_impl.super__Vector_impl_data._M_finish =
       (strides->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage =
       (strides->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (strides->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (strides->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (strides->v).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  array(this,(dtype *)&local_70,(ShapeContainer *)&local_48,(StridesContainer *)&local_68,ptr,base);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_68);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
  object::~object(&local_70);
  return;
}

Assistant:

array(ShapeContainer shape, StridesContainer strides, const T *ptr, handle base = handle())
        : array(pybind11::dtype::of<T>(), std::move(shape), std::move(strides), ptr, base) { }